

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLRParser.cpp
# Opt level: O1

bool GLRParser::isMarkerMovedRight(Production *originalProduction,Production *productionMovedRight)

{
  size_t sVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__first1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__last1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__first2;
  pointer pbVar2;
  bool bVar3;
  int iVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar6;
  string *psVar7;
  string *psVar8;
  undefined8 uVar9;
  ulong uVar10;
  pointer pbVar11;
  bool bVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  bool bVar16;
  string previoussymbol;
  undefined1 *local_90;
  char *local_88;
  undefined1 local_80;
  undefined7 uStack_7f;
  long *local_70;
  size_t local_68;
  long local_60 [2];
  long *local_50;
  size_t local_48;
  long local_40 [2];
  
  pvVar5 = Production::getToP_abi_cxx11_(originalProduction);
  pvVar6 = Production::getToP_abi_cxx11_(productionMovedRight);
  if ((long)(pvVar5->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish -
      (long)(pvVar5->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start ==
      (long)(pvVar6->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish -
      (long)(pvVar6->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start) {
    psVar7 = Production::getFromP_abi_cxx11_(originalProduction);
    psVar8 = Production::getFromP_abi_cxx11_(productionMovedRight);
    sVar1 = psVar7->_M_string_length;
    if ((sVar1 == psVar8->_M_string_length) &&
       ((sVar1 == 0 ||
        (iVar4 = bcmp((psVar7->_M_dataplus)._M_p,(psVar8->_M_dataplus)._M_p,sVar1), iVar4 == 0)))) {
      __first1 = (pvVar5->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
      __last1 = (pvVar5->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish;
      __first2 = (pvVar6->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
      if (((long)__last1 - (long)__first1 !=
           (long)(pvVar6->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish - (long)__first2) ||
         (bVar3 = std::__equal<false>::
                  equal<std::__cxx11::string_const*,std::__cxx11::string_const*>
                            (__first1,__last1,__first2), !bVar3)) {
        local_90 = &local_80;
        local_88 = (char *)0x0;
        local_80 = 0;
        pbVar11 = (pvVar5->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        lVar13 = (long)(pvVar5->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar11;
        bVar3 = lVar13 == 0;
        if (!bVar3) {
          uVar14 = lVar13 >> 5;
          lVar13 = 0;
          uVar15 = 0;
          bVar12 = false;
          do {
            pbVar2 = (pvVar6->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            uVar10 = (long)(pvVar6->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 >> 5;
            if (uVar10 <= uVar15) {
LAB_00132bb5:
              uVar9 = std::__throw_out_of_range_fmt
                                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                                 ,uVar15,uVar10);
              if (local_90 != &local_80) {
                operator_delete(local_90,CONCAT71(uStack_7f,local_80) + 1);
              }
              _Unwind_Resume(uVar9);
            }
            sVar1 = *(size_t *)((long)&pbVar11->_M_string_length + lVar13);
            if ((sVar1 != *(size_t *)((long)&pbVar2->_M_string_length + lVar13)) ||
               ((sVar1 != 0 &&
                (iVar4 = bcmp(*(void **)((long)&(pbVar11->_M_dataplus)._M_p + lVar13),
                              *(void **)((long)&(pbVar2->_M_dataplus)._M_p + lVar13),sVar1),
                iVar4 != 0)))) {
              uVar10 = uVar14;
              if (uVar14 <= uVar15) goto LAB_00132bb5;
              getMarker_abi_cxx11_();
              sVar1 = *(size_t *)((long)&pbVar11->_M_string_length + lVar13);
              if (sVar1 == local_48) {
                if (sVar1 == 0) {
                  bVar16 = true;
                }
                else {
                  iVar4 = bcmp(*(void **)((long)&(pbVar11->_M_dataplus)._M_p + lVar13),local_50,
                               sVar1);
                  bVar16 = iVar4 == 0;
                }
              }
              else {
                bVar16 = false;
              }
              if (local_50 != local_40) {
                operator_delete(local_50,local_40[0] + 1);
              }
              if (bVar16) {
                uVar10 = (long)(pvVar6->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_finish -
                         (long)(pvVar6->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start >> 5;
                if (uVar10 <= uVar15) goto LAB_00132bb5;
                bVar12 = true;
                std::__cxx11::string::_M_assign((string *)&local_90);
              }
              else {
                if (bVar12) {
                  pbVar11 = (pvVar5->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start;
                  uVar10 = (long)(pvVar5->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar11 >> 5;
                  if (uVar10 <= uVar15) goto LAB_00132bb5;
                  if ((local_88 != *(char **)((long)&pbVar11->_M_string_length + lVar13)) ||
                     ((local_88 != (char *)0x0 &&
                      (iVar4 = bcmp(local_90,*(void **)((long)&(pbVar11->_M_dataplus)._M_p + lVar13)
                                    ,(size_t)local_88), iVar4 != 0)))) goto LAB_00132abe;
                  pbVar11 = (pvVar6->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start;
                  uVar10 = (long)(pvVar6->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar11 >> 5;
                  if (uVar10 <= uVar15) goto LAB_00132bb5;
                  getMarker_abi_cxx11_();
                  sVar1 = *(size_t *)((long)&pbVar11->_M_string_length + lVar13);
                  if (sVar1 != local_68) {
                    bVar12 = true;
                    goto LAB_00132ac0;
                  }
                  bVar12 = true;
                  if (sVar1 == 0) {
                    bVar16 = true;
                  }
                  else {
                    iVar4 = bcmp(*(void **)((long)&(pbVar11->_M_dataplus)._M_p + lVar13),local_70,
                                 sVar1);
                    bVar16 = iVar4 == 0;
                  }
                }
                else {
LAB_00132abe:
                  bVar12 = false;
LAB_00132ac0:
                  bVar16 = false;
                }
                if ((bVar12) && (local_70 != local_60)) {
                  operator_delete(local_70,local_60[0] + 1);
                }
                if (!bVar16) break;
                bVar12 = false;
                std::__cxx11::string::_M_replace((ulong)&local_90,0,local_88,0x1430a4);
              }
            }
            uVar15 = uVar15 + 1;
            pbVar11 = (pvVar5->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            uVar14 = (long)(pvVar5->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar11 >> 5;
            lVar13 = lVar13 + 0x20;
            bVar3 = uVar14 <= uVar15;
          } while (uVar15 < uVar14);
        }
        if (local_90 == &local_80) {
          return bVar3;
        }
        operator_delete(local_90,CONCAT71(uStack_7f,local_80) + 1);
        return bVar3;
      }
    }
  }
  return false;
}

Assistant:

bool GLRParser::isMarkerMovedRight(Production *originalProduction, Production *productionMovedRight) {
    const auto &originalProductionTo = originalProduction->getToP();
    const auto &productionMovedRightTo = productionMovedRight->getToP();

    if (originalProductionTo.size() != productionMovedRightTo.size() ||
        originalProduction->getFromP() != productionMovedRight->getFromP() ||
        originalProductionTo == productionMovedRightTo) {
        return false;
    }

    bool previousMarker = false;
    std::string previoussymbol;
    for (int i = 0; i < originalProductionTo.size(); ++i) {
        if (originalProductionTo.at(i) != productionMovedRightTo.at(i)) {

            if (originalProductionTo.at(i) == getMarker()) {
                // Case: This is the original marker
                previousMarker = true;
                previoussymbol = productionMovedRightTo.at(i);

            } else if (previousMarker &&
                       previoussymbol == originalProductionTo.at(i) &&
                       productionMovedRightTo.at(i) == getMarker()) {
                // Case: This is the moved marker
                previoussymbol = "";
                previousMarker = false;

            } else {
                return false;
            }
        }
    }
    return true;
}